

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consist.c
# Opt level: O1

void consistency(void)

{
  Item *pIVar1;
  Item *pIVar2;
  bool bVar3;
  Symbol *pSVar4;
  List *pLVar5;
  uint uVar6;
  long lVar7;
  
  if ((scop_indep != indepsym) && (scop_indep->subtype == 6)) {
    scop_indep->subtype = 4;
  }
  lVar7 = 0x41;
  bVar3 = false;
  do {
    pLVar5 = symlist[lVar7]->next;
    if (pLVar5 != symlist[lVar7]) {
      do {
        pIVar2 = (pLVar5->element).itm;
        if (pIVar2->itemtype == 0x13e) {
          pIVar1 = (pIVar2->element).itm;
          if ((Item *)0x1 < pIVar1 && ((ulong)pIVar1 & 1) != 0) {
            consistency_cold_1();
            bVar3 = true;
          }
          uVar6 = (uint)pIVar1;
          if (((ulong)pIVar1 & 0xffffffffff2b7fff) != 0 && ((ulong)pIVar1 & 0xd48000) != 0) {
            consistency_cold_2();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xfffffffffff7ffff) != 0 && (uVar6 >> 0x13 & 1) != 0) {
            consistency_cold_3();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xffffffffffffffdd) != 0 && ((ulong)pIVar1 & 2) != 0) {
            consistency_cold_4();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xffffffffffffffd7) != 0 && ((ulong)pIVar1 & 8) != 0) {
            consistency_cold_5();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xfffffffffffffffb) != 0 && ((ulong)pIVar1 & 4) != 0) {
            consistency_cold_6();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xffffffffffffffcf) != 0 && ((ulong)pIVar1 & 0x10) != 0) {
            consistency_cold_7();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xffffffffffffffbf) != 0 && ((ulong)pIVar1 & 0x40) != 0) {
            consistency_cold_8();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xffffffffffffff7f) != 0 && (char)pIVar1 < '\0') {
            consistency_cold_9();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xfffffffffffffdff) != 0 && (uVar6 >> 9 & 1) != 0) {
            consistency_cold_10();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xfffffffffffffbff) != 0 && (uVar6 >> 10 & 1) != 0) {
            consistency_cold_11();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xfffffffffffeffff) != 0 && (uVar6 >> 0x10 & 1) != 0) {
            consistency_cold_12();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xfffffffffffff7ff) != 0 && (uVar6 >> 0xb & 1) != 0) {
            consistency_cold_13();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xffffffffffffefff) != 0 && (uVar6 >> 0xc & 1) != 0) {
            consistency_cold_14();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xffffffffffffbfff) != 0 && (uVar6 >> 0xe & 1) != 0) {
            consistency_cold_15();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xffffffffffffdfff) != 0 && (uVar6 >> 0xd & 1) != 0) {
            consistency_cold_16();
            bVar3 = true;
          }
          if (((ulong)pIVar1 & 0xfffffffffffdffff) != 0 && (uVar6 >> 0x11 & 1) != 0) {
            consistency_cold_17();
            bVar3 = true;
          }
          uVar6 = *(uint *)((long)&pIVar2[1].next + 4);
          if ((~uVar6 & 0x48) == 0) {
            diag(pIVar2[2].element.str," used as both variable and function");
          }
          if (uVar6 != 0 && pIVar1 == (Item *)0x0) {
            consistency_cold_18();
          }
        }
        pLVar5 = pLVar5->next;
      } while (pLVar5 != symlist[lVar7]);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x7b);
  if (bVar3) {
    diag("multiple uses for same variable",(char *)0x0);
  }
  if (indepsym != (Symbol *)0x0) {
    lVar7 = 0x41;
    do {
      pLVar5 = symlist[lVar7]->next;
      if (pLVar5 != symlist[lVar7]) {
        do {
          pIVar2 = (pLVar5->element).itm;
          if ((((pIVar2->itemtype == 0x13e) && (((ulong)pIVar2->element & 0x10) != 0)) &&
              (*pIVar2[2].element.str == 'D')) &&
             (((pSVar4 = lookup(pIVar2[2].element.str + 1), pSVar4 != (Symbol *)0x0 &&
               (pIVar2->itemtype == 0x13e)) && (((ulong)pIVar2->element & 0x10) != 0)))) {
            consistency_cold_19();
          }
          pLVar5 = pLVar5->next;
        } while (pLVar5 != symlist[lVar7]);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x7b);
    return;
  }
  diag("Independent variable is not defined",(char *)0x0);
}

Assistant:

void consistency()
{
	Symbol         *s;
	Item           *qs;
	int             i, tu, err = 0;
	long            t;


	/* the scop_indep can also be a automatic parameter */
	if (scop_indep != indepsym && scop_indep->subtype == (PARM | INDEP)) {
		scop_indep->subtype = INDEP;
	}
	
	SYMITER(NAME) {
		t = s->subtype;
		con("KEYWORD", KEYWORD, 0);
		con("RESERVED WORD", EXTDEF|EXTDEF2|EXTDEF3|EXTDEF4|EXTDEF5, 0);
		con("CONSTANT", nmodlCONST, 0);
		con("PARAMETER", PARM, ARRAY);
		con("ASSIGNED", DEP, ARRAY);
		con("INDEPENDENT", INDEP, 0);
		con("STATE", STAT, ARRAY);
		con("FUNCTION", FUNCT, 0);
		con("PROCEDURE", PROCED, 0);
		con("DERIVATIVE", DERF, 0);
		con(" KINETIC", KINF, 0);
		con("LINEAR", LINF, 0);
		con("NONLINEAR", NLINF, 0);
		con("DISCRETE", DISCF, 0);
		con("PARTIAL", PARF, 0);
		con("STEPPED", STEP1, 0);
		con("CONSTANT UNITS FACTOR", UNITDEF, 0);
		tu = s->usage;
		if ((tu & DEP) && (tu & FUNCT))
			diag(s->name, " used as both variable and function");
		if ((t == 0) && tu)
			Fprintf(stderr,
				"Warning: %s undefined. (declared within VERBATIM?)\n", s->name);
	}
	if (err) {
		diag("multiple uses for same variable", (char *) 0);
	}
	if (indepsym == SYM0) {
		diag("Independent variable is not defined", (char *)0);
	}
	/* avoid the problem where person inadvertently is using Dstate as a state*/
	SYMITER(NAME) {
		if ((s->subtype & STAT) && (s->name[0] == 'D')) {
			Symbol* s1 = lookup(s->name + 1);
			if (s1 && s->type == NAME && (s->subtype & STAT)) {
fprintf(stderr, "%s is a STATE so %s is a %s' and", s1->name, s->name, s1->name);
diag(" cannot be declared as a STATE\n", (char*)0);
			}
		}
	}
}